

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator * __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
             *this,void *value)

{
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_RDX;
  long in_RSI;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_RDI;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar1;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *this_00;
  void *in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  if (*(long *)(in_RSI + 0x28) != 0) {
    uVar1 = *(undefined1 *)(*(long *)(in_RSI + 0x28) + 0x11);
    error_handler::error_handler((error_handler *)&stack0xffffffffffffffef);
    check_pointer_type_spec<char,fmt::v5::internal::error_handler>
              ((char)((ulong)this_00 >> 0x38),
               (error_handler *)CONCAT17(uVar1,in_stack_ffffffffffffffc8));
  }
  write_pointer(in_RDX,in_stack_ffffffffffffffe8);
  out(this_00);
  return (iterator *)in_RDI;
}

Assistant:

iterator operator()(const void *value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }